

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O3

void evutil_rtrim_lws_(char *str)

{
  size_t sVar1;
  
  if (str != (char *)0x0) {
    for (sVar1 = strlen(str); (sVar1 != 0 && ((str[sVar1 - 1] == ' ' || (str[sVar1 - 1] == '\t'))));
        sVar1 = sVar1 - 1) {
      str[sVar1 - 1] = '\0';
    }
  }
  return;
}

Assistant:

void
evutil_rtrim_lws_(char *str)
{
	char *cp;

	if (str == NULL)
		return;

	if ((cp = strchr(str, '\0')) == NULL || (cp == str))
		return;

	--cp;

	while (*cp == ' ' || *cp == '\t') {
		*cp = '\0';
		if (cp == str)
			break;
		--cp;
	}
}